

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<8,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar10;
  ushort uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  bool bVar36;
  int iVar37;
  long lVar38;
  byte bVar39;
  uint uVar40;
  undefined4 uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong *puVar45;
  long lVar46;
  ulong uVar47;
  long lVar48;
  uint uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  uint uVar54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  bool bVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  float fVar64;
  float fVar65;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [564];
  RTCFilterFunctionNArguments local_16d0;
  undefined8 local_16a0;
  uint uStack_1698;
  uint uStack_1694;
  uint uStack_1690;
  uint uStack_168c;
  uint uStack_1688;
  uint uStack_1684;
  uint local_1680;
  uint uStack_167c;
  uint uStack_1678;
  uint uStack_1674;
  uint uStack_1670;
  uint uStack_166c;
  uint uStack_1668;
  uint uStack_1664;
  undefined1 local_1660 [32];
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  float fStack_1624;
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [8];
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined4 local_14c0;
  undefined4 uStack_14bc;
  undefined4 uStack_14b8;
  undefined4 uStack_14b4;
  undefined4 uStack_14b0;
  undefined4 uStack_14ac;
  undefined4 uStack_14a8;
  undefined4 uStack_14a4;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1400 [32];
  float local_13e0 [4];
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0 [4];
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0 [4];
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined4 local_1300;
  undefined4 uStack_12fc;
  undefined4 uStack_12f8;
  undefined4 uStack_12f4;
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined4 local_12e0;
  undefined4 uStack_12dc;
  undefined4 uStack_12d8;
  undefined4 uStack_12d4;
  undefined4 uStack_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  puVar45 = local_11f8;
  local_1200 = root.ptr;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar115 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,CONCAT412(
                                                  fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))))))));
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_14e0._4_4_ = fVar3;
  local_14e0._0_4_ = fVar3;
  local_14e0._8_4_ = fVar3;
  local_14e0._12_4_ = fVar3;
  local_14e0._16_4_ = fVar3;
  local_14e0._20_4_ = fVar3;
  local_14e0._24_4_ = fVar3;
  local_14e0._28_4_ = fVar3;
  auVar94 = ZEXT3264(local_14e0);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1500._4_4_ = fVar4;
  local_1500._0_4_ = fVar4;
  local_1500._8_4_ = fVar4;
  local_1500._12_4_ = fVar4;
  local_1500._16_4_ = fVar4;
  local_1500._20_4_ = fVar4;
  local_1500._24_4_ = fVar4;
  local_1500._28_4_ = fVar4;
  auVar97 = ZEXT3264(local_1500);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1520._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_1520._8_4_ = -fVar2;
  local_1520._12_4_ = -fVar2;
  local_1520._16_4_ = -fVar2;
  local_1520._20_4_ = -fVar2;
  local_1520._24_4_ = -fVar2;
  local_1520._28_4_ = -fVar2;
  auVar101 = ZEXT3264(local_1520);
  local_1540._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  local_1540._8_4_ = -fVar3;
  local_1540._12_4_ = -fVar3;
  local_1540._16_4_ = -fVar3;
  local_1540._20_4_ = -fVar3;
  local_1540._24_4_ = -fVar3;
  local_1540._28_4_ = -fVar3;
  auVar104 = ZEXT3264(local_1540);
  local_14c0 = 0x80000000;
  uStack_14bc = 0x80000000;
  uStack_14b8 = 0x80000000;
  uStack_14b4 = 0x80000000;
  uStack_14b0 = 0x80000000;
  uStack_14ac = 0x80000000;
  uStack_14a8 = 0x80000000;
  uStack_14a4 = 0x80000000;
  local_1560._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  local_1560._8_4_ = -fVar4;
  local_1560._12_4_ = -fVar4;
  local_1560._16_4_ = -fVar4;
  local_1560._20_4_ = -fVar4;
  local_1560._24_4_ = -fVar4;
  local_1560._28_4_ = -fVar4;
  auVar107 = ZEXT3264(local_1560);
  iVar37 = (tray->tnear).field_0.i[k];
  local_1580._4_4_ = iVar37;
  local_1580._0_4_ = iVar37;
  local_1580._8_4_ = iVar37;
  local_1580._12_4_ = iVar37;
  local_1580._16_4_ = iVar37;
  local_1580._20_4_ = iVar37;
  local_1580._24_4_ = iVar37;
  local_1580._28_4_ = iVar37;
  auVar110 = ZEXT3264(local_1580);
  iVar37 = (tray->tfar).field_0.i[k];
  local_15a0._4_4_ = iVar37;
  local_15a0._0_4_ = iVar37;
  local_15a0._8_4_ = iVar37;
  local_15a0._12_4_ = iVar37;
  local_15a0._16_4_ = iVar37;
  local_15a0._20_4_ = iVar37;
  local_15a0._24_4_ = iVar37;
  local_15a0._28_4_ = iVar37;
  auVar114 = ZEXT3264(local_15a0);
  local_15c0._16_16_ = mm_lookupmask_ps._240_16_;
  local_15c0._0_16_ = mm_lookupmask_ps._0_16_;
  iVar37 = 1 << ((uint)k & 0x1f);
  auVar100._4_4_ = iVar37;
  auVar100._0_4_ = iVar37;
  auVar100._8_4_ = iVar37;
  auVar100._12_4_ = iVar37;
  auVar100._16_4_ = iVar37;
  auVar100._20_4_ = iVar37;
  auVar100._24_4_ = iVar37;
  auVar100._28_4_ = iVar37;
  auVar60 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar100 = vpand_avx2(auVar100,auVar60);
  local_1600 = vpcmpeqd_avx2(auVar100,auVar60);
  auVar60._8_4_ = 0xbf800000;
  auVar60._0_8_ = 0xbf800000bf800000;
  auVar60._12_4_ = 0xbf800000;
  auVar60._16_4_ = 0xbf800000;
  auVar60._20_4_ = 0xbf800000;
  auVar60._24_4_ = 0xbf800000;
  auVar60._28_4_ = 0xbf800000;
  auVar66._8_4_ = 0x3f800000;
  auVar66._0_8_ = 0x3f8000003f800000;
  auVar66._12_4_ = 0x3f800000;
  auVar66._16_4_ = 0x3f800000;
  auVar66._20_4_ = 0x3f800000;
  auVar66._24_4_ = 0x3f800000;
  auVar66._28_4_ = 0x3f800000;
  _local_15e0 = vblendvps_avx(auVar66,auVar60,local_15c0);
  bVar36 = true;
  do {
    uVar53 = puVar45[-1];
    puVar45 = puVar45 + -1;
    while ((uVar53 & 8) == 0) {
      auVar59 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar47),auVar101._0_32_,
                                auVar115._0_32_);
      auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar50),auVar104._0_32_,
                                auVar94._0_32_);
      auVar100 = vpmaxsd_avx2(ZEXT1632(auVar59),ZEXT1632(auVar23));
      auVar59 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + uVar51),auVar107._0_32_,
                                auVar97._0_32_);
      auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + (uVar47 ^ 0x20)),
                                auVar101._0_32_,auVar115._0_32_);
      auVar24 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + (uVar50 ^ 0x20)),
                                auVar104._0_32_,auVar94._0_32_);
      auVar66 = vpminsd_avx2(ZEXT1632(auVar23),ZEXT1632(auVar24));
      auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar53 + 0x40 + (uVar51 ^ 0x20)),
                                auVar107._0_32_,auVar97._0_32_);
      auVar60 = vpmaxsd_avx2(ZEXT1632(auVar59),auVar110._0_32_);
      auVar100 = vpmaxsd_avx2(auVar100,auVar60);
      auVar60 = vpminsd_avx2(ZEXT1632(auVar23),auVar114._0_32_);
      auVar60 = vpminsd_avx2(auVar66,auVar60);
      auVar100 = vpcmpgtd_avx2(auVar100,auVar60);
      iVar37 = vmovmskps_avx(auVar100);
      if (iVar37 == 0xff) goto joined_r0x006582ba;
      bVar39 = ~(byte)iVar37;
      uVar55 = uVar53 & 0xfffffffffffffff0;
      lVar38 = 0;
      for (uVar53 = (ulong)bVar39; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
        lVar38 = lVar38 + 1;
      }
      uVar53 = *(ulong *)(uVar55 + lVar38 * 8);
      uVar40 = bVar39 - 1 & (uint)bVar39;
      uVar44 = (ulong)uVar40;
      if (uVar40 != 0) {
        *puVar45 = uVar53;
        lVar38 = 0;
        for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
          lVar38 = lVar38 + 1;
        }
        uVar40 = uVar40 - 1 & uVar40;
        uVar44 = (ulong)uVar40;
        bVar58 = uVar40 == 0;
        while( true ) {
          puVar45 = puVar45 + 1;
          uVar53 = *(ulong *)(uVar55 + lVar38 * 8);
          if (bVar58) break;
          *puVar45 = uVar53;
          lVar38 = 0;
          for (uVar53 = uVar44; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
            lVar38 = lVar38 + 1;
          }
          uVar44 = uVar44 - 1 & uVar44;
          bVar58 = uVar44 == 0;
        }
      }
    }
    uVar55 = (ulong)((uint)uVar53 & 0xf);
    if (uVar55 != 8) {
      uVar53 = uVar53 & 0xfffffffffffffff0;
      lVar38 = 0;
      do {
        lVar42 = lVar38 * 0x90;
        lVar1 = uVar53 + lVar42;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)(uVar53 + 0x40 + lVar42);
        auVar24 = vpmovzxbw_avx(auVar59);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(uVar53 + 0x48 + lVar42);
        auVar59 = vpmovzxbw_avx(auVar23);
        auVar59 = vpminuw_avx(auVar24,auVar59);
        auVar59 = vpcmpeqw_avx(auVar24,auVar59);
        auVar59 = vpacksswb_avx(auVar59,auVar59);
        uVar41 = *(undefined4 *)(uVar53 + 0x70 + lVar42);
        auVar67._4_4_ = uVar41;
        auVar67._0_4_ = uVar41;
        auVar67._8_4_ = uVar41;
        auVar67._12_4_ = uVar41;
        auVar67._16_4_ = uVar41;
        auVar67._20_4_ = uVar41;
        auVar67._24_4_ = uVar41;
        auVar67._28_4_ = uVar41;
        uVar41 = *(undefined4 *)(uVar53 + 0x7c + lVar42);
        auVar81._4_4_ = uVar41;
        auVar81._0_4_ = uVar41;
        auVar81._8_4_ = uVar41;
        auVar81._12_4_ = uVar41;
        auVar81._16_4_ = uVar41;
        auVar81._20_4_ = uVar41;
        auVar81._24_4_ = uVar41;
        auVar81._28_4_ = uVar41;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)((uVar47 >> 2) + 0x40 + lVar1);
        auVar100 = vpmovzxbd_avx2(auVar24);
        auVar100 = vcvtdq2ps_avx(auVar100);
        auVar23 = vfmadd213ps_fma(auVar100,auVar81,auVar67);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *(ulong *)(((uVar47 ^ 0x20) >> 2) + 0x40 + lVar1);
        auVar100 = vpmovzxbd_avx2(auVar5);
        auVar100 = vcvtdq2ps_avx(auVar100);
        auVar24 = vfmadd213ps_fma(auVar100,auVar81,auVar67);
        uVar41 = *(undefined4 *)(uVar53 + 0x74 + lVar42);
        auVar68._4_4_ = uVar41;
        auVar68._0_4_ = uVar41;
        auVar68._8_4_ = uVar41;
        auVar68._12_4_ = uVar41;
        auVar68._16_4_ = uVar41;
        auVar68._20_4_ = uVar41;
        auVar68._24_4_ = uVar41;
        auVar68._28_4_ = uVar41;
        uVar41 = *(undefined4 *)(uVar53 + 0x80 + lVar42);
        auVar82._4_4_ = uVar41;
        auVar82._0_4_ = uVar41;
        auVar82._8_4_ = uVar41;
        auVar82._12_4_ = uVar41;
        auVar82._16_4_ = uVar41;
        auVar82._20_4_ = uVar41;
        auVar82._24_4_ = uVar41;
        auVar82._28_4_ = uVar41;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)((uVar50 >> 2) + 0x40 + lVar1);
        auVar100 = vpmovzxbd_avx2(auVar6);
        auVar100 = vcvtdq2ps_avx(auVar100);
        auVar5 = vfmadd213ps_fma(auVar100,auVar82,auVar68);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(ulong *)(((uVar50 ^ 0x20) >> 2) + 0x40 + lVar1);
        auVar100 = vpmovzxbd_avx2(auVar7);
        auVar100 = vcvtdq2ps_avx(auVar100);
        auVar6 = vfmadd213ps_fma(auVar100,auVar82,auVar68);
        uVar41 = *(undefined4 *)(uVar53 + 0x78 + lVar42);
        auVar69._4_4_ = uVar41;
        auVar69._0_4_ = uVar41;
        auVar69._8_4_ = uVar41;
        auVar69._12_4_ = uVar41;
        auVar69._16_4_ = uVar41;
        auVar69._20_4_ = uVar41;
        auVar69._24_4_ = uVar41;
        auVar69._28_4_ = uVar41;
        uVar41 = *(undefined4 *)(uVar53 + 0x84 + lVar42);
        auVar83._4_4_ = uVar41;
        auVar83._0_4_ = uVar41;
        auVar83._8_4_ = uVar41;
        auVar83._12_4_ = uVar41;
        auVar83._16_4_ = uVar41;
        auVar83._20_4_ = uVar41;
        auVar83._24_4_ = uVar41;
        auVar83._28_4_ = uVar41;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)((uVar51 >> 2) + 0x40 + lVar1);
        auVar100 = vpmovzxbd_avx2(auVar8);
        auVar100 = vcvtdq2ps_avx(auVar100);
        auVar7 = vfmadd213ps_fma(auVar100,auVar83,auVar69);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)(((uVar51 ^ 0x20) >> 2) + 0x40 + lVar1);
        auVar100 = vpmovzxbd_avx2(auVar9);
        auVar100 = vcvtdq2ps_avx(auVar100);
        auVar8 = vfmadd213ps_fma(auVar100,auVar83,auVar69);
        auVar23 = vfmadd213ps_fma(ZEXT1632(auVar23),auVar115._0_32_,auVar101._0_32_);
        auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar94._0_32_,auVar104._0_32_);
        auVar100 = vpmaxsd_avx2(ZEXT1632(auVar23),ZEXT1632(auVar5));
        auVar23 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar97._0_32_,auVar107._0_32_);
        auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar115._0_32_,auVar101._0_32_);
        auVar5 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar94._0_32_,auVar104._0_32_);
        auVar66 = vpminsd_avx2(ZEXT1632(auVar24),ZEXT1632(auVar5));
        auVar24 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar97._0_32_,auVar107._0_32_);
        auVar60 = vpmaxsd_avx2(ZEXT1632(auVar23),auVar110._0_32_);
        auVar100 = vpmaxsd_avx2(auVar100,auVar60);
        auVar60 = vpminsd_avx2(ZEXT1632(auVar24),auVar114._0_32_);
        auVar60 = vpminsd_avx2(auVar66,auVar60);
        auVar100 = vpcmpgtd_avx2(auVar100,auVar60);
        uVar41 = vmovmskps_avx(auVar100);
        bVar39 = ~(byte)uVar41 &
                 (SUB161(auVar59 >> 7,0) & 1 | (SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                  (SUB161(auVar59 >> 0x17,0) & 1) << 2 | (SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                  (SUB161(auVar59 >> 0x27,0) & 1) << 4 | (SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                  (SUB161(auVar59 >> 0x37,0) & 1) << 6 | SUB161(auVar59 >> 0x3f,0) << 7);
        if (bVar39 != 0) {
          uVar44 = (ulong)bVar39;
          do {
            lVar42 = 0;
            for (uVar52 = uVar44; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
              lVar42 = lVar42 + 1;
            }
            uVar10 = *(ushort *)(lVar1 + lVar42 * 8);
            uVar11 = *(ushort *)(lVar1 + 2 + lVar42 * 8);
            local_1680 = *(uint *)(lVar1 + 0x88);
            uStack_1698 = *(uint *)(lVar1 + 4 + lVar42 * 8);
            pGVar12 = (context->scene->geometries).items[local_1680].ptr;
            lVar42 = *(long *)&pGVar12->field_0x58;
            lVar48 = pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     (ulong)uStack_1698;
            uVar49 = uVar10 & 0x7fff;
            uVar54 = uVar11 & 0x7fff;
            uVar40 = *(uint *)(lVar42 + 4 + lVar48);
            uVar57 = (ulong)uVar40;
            uVar43 = (ulong)(uVar40 * uVar54 + *(int *)(lVar42 + lVar48) + uVar49);
            p_Var13 = pGVar12[1].intersectionFilterN;
            lVar14 = *(long *)&pGVar12[1].time_range.upper;
            auVar59 = *(undefined1 (*) [16])(lVar14 + (uVar43 + 1) * (long)p_Var13);
            auVar23 = *(undefined1 (*) [16])(lVar14 + (uVar43 + uVar57) * (long)p_Var13);
            lVar56 = uVar43 + uVar57 + 1;
            auVar24 = *(undefined1 (*) [16])(lVar14 + lVar56 * (long)p_Var13);
            auVar5 = *(undefined1 (*) [16])
                      (lVar14 + (uVar43 + (-1 < (short)uVar10) + 1) * (long)p_Var13);
            lVar46 = (ulong)(-1 < (short)uVar10) + lVar56;
            auVar6 = *(undefined1 (*) [16])(lVar14 + lVar46 * (long)p_Var13);
            uVar52 = 0;
            if (-1 < (short)uVar11) {
              uVar52 = uVar57;
            }
            auVar7 = *(undefined1 (*) [16])(lVar14 + (uVar43 + uVar57 + uVar52) * (long)p_Var13);
            auVar8 = *(undefined1 (*) [16])(lVar14 + (lVar56 + uVar52) * (long)p_Var13);
            auVar92._16_16_ = *(undefined1 (*) [16])(lVar14 + (uVar52 + lVar46) * (long)p_Var13);
            auVar92._0_16_ = auVar24;
            auVar88 = vunpcklps_avx(auVar59,auVar6);
            auVar9 = vunpckhps_avx(auVar59,auVar6);
            auVar95 = vunpcklps_avx(auVar5,auVar24);
            auVar5 = vunpckhps_avx(auVar5,auVar24);
            auVar15 = vunpcklps_avx(auVar9,auVar5);
            auVar16 = vunpcklps_avx(auVar88,auVar95);
            auVar5 = vunpckhps_avx(auVar88,auVar95);
            auVar88 = vunpcklps_avx(auVar23,auVar8);
            auVar9 = vunpckhps_avx(auVar23,auVar8);
            auVar95 = vunpcklps_avx(auVar24,auVar7);
            auVar7 = vunpckhps_avx(auVar24,auVar7);
            auVar9 = vunpcklps_avx(auVar9,auVar7);
            auVar17 = vunpcklps_avx(auVar88,auVar95);
            auVar7 = vunpckhps_avx(auVar88,auVar95);
            auVar84._16_16_ = auVar8;
            auVar84._0_16_ = auVar23;
            auVar70._16_16_ = auVar6;
            auVar70._0_16_ = auVar59;
            auVar100 = vunpcklps_avx(auVar70,auVar84);
            auVar61._16_16_ = auVar24;
            auVar61._0_16_ = *(undefined1 (*) [16])(lVar14 + (long)p_Var13 * uVar43);
            auVar60 = vunpcklps_avx(auVar61,auVar92);
            auVar81 = vunpcklps_avx(auVar60,auVar100);
            auVar82 = vunpckhps_avx(auVar60,auVar100);
            auVar100 = vunpckhps_avx(auVar70,auVar84);
            auVar60 = vunpckhps_avx(auVar61,auVar92);
            auVar83 = vunpcklps_avx(auVar60,auVar100);
            auVar62._16_16_ = auVar16;
            auVar62._0_16_ = auVar16;
            auVar85._16_16_ = auVar5;
            auVar85._0_16_ = auVar5;
            auVar89._16_16_ = auVar15;
            auVar89._0_16_ = auVar15;
            auVar91._16_16_ = auVar17;
            auVar91._0_16_ = auVar17;
            auVar98._16_16_ = auVar7;
            auVar98._0_16_ = auVar7;
            auVar102._16_16_ = auVar9;
            auVar102._0_16_ = auVar9;
            auVar60 = vsubps_avx(auVar81,auVar62);
            auVar100 = vsubps_avx(auVar82,auVar85);
            auVar66 = vsubps_avx(auVar83,auVar89);
            auVar67 = vsubps_avx(auVar91,auVar81);
            auVar68 = vsubps_avx(auVar98,auVar82);
            auVar69 = vsubps_avx(auVar102,auVar83);
            auVar25._4_4_ = auVar100._4_4_ * auVar69._4_4_;
            auVar25._0_4_ = auVar100._0_4_ * auVar69._0_4_;
            auVar25._8_4_ = auVar100._8_4_ * auVar69._8_4_;
            auVar25._12_4_ = auVar100._12_4_ * auVar69._12_4_;
            auVar25._16_4_ = auVar100._16_4_ * auVar69._16_4_;
            auVar25._20_4_ = auVar100._20_4_ * auVar69._20_4_;
            auVar25._24_4_ = auVar100._24_4_ * auVar69._24_4_;
            auVar25._28_4_ = auVar16._12_4_;
            auVar6 = vfmsub231ps_fma(auVar25,auVar68,auVar66);
            uVar41 = *(undefined4 *)(ray + k * 4);
            auVar105._4_4_ = uVar41;
            auVar105._0_4_ = uVar41;
            auVar105._8_4_ = uVar41;
            auVar105._12_4_ = uVar41;
            auVar105._16_4_ = uVar41;
            auVar105._20_4_ = uVar41;
            auVar105._24_4_ = uVar41;
            auVar105._28_4_ = uVar41;
            uVar41 = *(undefined4 *)(ray + k * 4 + 0x20);
            auVar108._4_4_ = uVar41;
            auVar108._0_4_ = uVar41;
            auVar108._8_4_ = uVar41;
            auVar108._12_4_ = uVar41;
            auVar108._16_4_ = uVar41;
            auVar108._20_4_ = uVar41;
            auVar108._24_4_ = uVar41;
            auVar108._28_4_ = uVar41;
            uVar41 = *(undefined4 *)(ray + k * 4 + 0x40);
            auVar111._4_4_ = uVar41;
            auVar111._0_4_ = uVar41;
            auVar111._8_4_ = uVar41;
            auVar111._12_4_ = uVar41;
            auVar111._16_4_ = uVar41;
            auVar111._20_4_ = uVar41;
            auVar111._24_4_ = uVar41;
            auVar111._28_4_ = uVar41;
            fVar2 = *(float *)(ray + k * 4 + 0x80);
            auVar99._4_4_ = fVar2;
            auVar99._0_4_ = fVar2;
            auVar99._8_4_ = fVar2;
            auVar99._12_4_ = fVar2;
            auVar99._16_4_ = fVar2;
            auVar99._20_4_ = fVar2;
            auVar99._24_4_ = fVar2;
            auVar99._28_4_ = fVar2;
            auVar26._4_4_ = auVar66._4_4_ * auVar67._4_4_;
            auVar26._0_4_ = auVar66._0_4_ * auVar67._0_4_;
            auVar26._8_4_ = auVar66._8_4_ * auVar67._8_4_;
            auVar26._12_4_ = auVar66._12_4_ * auVar67._12_4_;
            auVar26._16_4_ = auVar66._16_4_ * auVar67._16_4_;
            auVar26._20_4_ = auVar66._20_4_ * auVar67._20_4_;
            auVar26._24_4_ = auVar66._24_4_ * auVar67._24_4_;
            auVar26._28_4_ = auVar5._12_4_;
            auVar81 = vsubps_avx(auVar81,auVar105);
            fVar3 = *(float *)(ray + k * 4 + 0xa0);
            auVar106._4_4_ = fVar3;
            auVar106._0_4_ = fVar3;
            auVar106._8_4_ = fVar3;
            auVar106._12_4_ = fVar3;
            auVar106._16_4_ = fVar3;
            auVar106._20_4_ = fVar3;
            auVar106._24_4_ = fVar3;
            auVar106._28_4_ = fVar3;
            auVar5 = vfmsub231ps_fma(auVar26,auVar69,auVar60);
            auVar82 = vsubps_avx(auVar82,auVar108);
            fVar4 = *(float *)(ray + k * 4 + 0xc0);
            auVar109._4_4_ = fVar4;
            auVar109._0_4_ = fVar4;
            auVar109._8_4_ = fVar4;
            auVar109._12_4_ = fVar4;
            auVar109._16_4_ = fVar4;
            auVar109._20_4_ = fVar4;
            auVar109._24_4_ = fVar4;
            auVar109._28_4_ = fVar4;
            auVar83 = vsubps_avx(auVar83,auVar111);
            auVar27._4_4_ = fVar2 * auVar82._4_4_;
            auVar27._0_4_ = fVar2 * auVar82._0_4_;
            auVar27._8_4_ = fVar2 * auVar82._8_4_;
            auVar27._12_4_ = fVar2 * auVar82._12_4_;
            auVar27._16_4_ = fVar2 * auVar82._16_4_;
            auVar27._20_4_ = fVar2 * auVar82._20_4_;
            auVar27._24_4_ = fVar2 * auVar82._24_4_;
            auVar27._28_4_ = uVar41;
            auVar59 = vfmsub231ps_fma(auVar27,auVar81,auVar106);
            auVar28._4_4_ = auVar69._4_4_ * auVar59._4_4_;
            auVar28._0_4_ = auVar69._0_4_ * auVar59._0_4_;
            auVar28._8_4_ = auVar69._8_4_ * auVar59._8_4_;
            auVar28._12_4_ = auVar69._12_4_ * auVar59._12_4_;
            auVar28._16_4_ = auVar69._16_4_ * 0.0;
            auVar28._20_4_ = auVar69._20_4_ * 0.0;
            auVar28._24_4_ = auVar69._24_4_ * 0.0;
            auVar28._28_4_ = auVar69._28_4_;
            auVar29._4_4_ = auVar66._4_4_ * auVar59._4_4_;
            auVar29._0_4_ = auVar66._0_4_ * auVar59._0_4_;
            auVar29._8_4_ = auVar66._8_4_ * auVar59._8_4_;
            auVar29._12_4_ = auVar66._12_4_ * auVar59._12_4_;
            auVar29._16_4_ = auVar66._16_4_ * 0.0;
            auVar29._20_4_ = auVar66._20_4_ * 0.0;
            auVar29._24_4_ = auVar66._24_4_ * 0.0;
            auVar29._28_4_ = auVar66._28_4_;
            auVar112._0_4_ = fVar4 * auVar81._0_4_;
            auVar112._4_4_ = fVar4 * auVar81._4_4_;
            auVar112._8_4_ = fVar4 * auVar81._8_4_;
            auVar112._12_4_ = fVar4 * auVar81._12_4_;
            auVar112._16_4_ = fVar4 * auVar81._16_4_;
            auVar112._20_4_ = fVar4 * auVar81._20_4_;
            auVar112._24_4_ = fVar4 * auVar81._24_4_;
            auVar112._28_4_ = 0;
            auVar23 = vfmsub231ps_fma(auVar112,auVar83,auVar99);
            auVar59 = vfmadd231ps_fma(auVar28,ZEXT1632(auVar23),auVar68);
            auVar23 = vfmadd231ps_fma(auVar29,auVar100,ZEXT1632(auVar23));
            auVar30._4_4_ = auVar60._4_4_ * auVar68._4_4_;
            auVar30._0_4_ = auVar60._0_4_ * auVar68._0_4_;
            auVar30._8_4_ = auVar60._8_4_ * auVar68._8_4_;
            auVar30._12_4_ = auVar60._12_4_ * auVar68._12_4_;
            auVar30._16_4_ = auVar60._16_4_ * auVar68._16_4_;
            auVar30._20_4_ = auVar60._20_4_ * auVar68._20_4_;
            auVar30._24_4_ = auVar60._24_4_ * auVar68._24_4_;
            auVar30._28_4_ = auVar68._28_4_;
            auVar24 = vfmsub231ps_fma(auVar30,auVar67,auVar100);
            auVar113._0_4_ = fVar3 * auVar83._0_4_;
            auVar113._4_4_ = fVar3 * auVar83._4_4_;
            auVar113._8_4_ = fVar3 * auVar83._8_4_;
            auVar113._12_4_ = fVar3 * auVar83._12_4_;
            auVar113._16_4_ = fVar3 * auVar83._16_4_;
            auVar113._20_4_ = fVar3 * auVar83._20_4_;
            auVar113._24_4_ = fVar3 * auVar83._24_4_;
            auVar113._28_4_ = 0;
            auVar7 = vfmsub231ps_fma(auVar113,auVar82,auVar109);
            fVar2 = auVar24._0_4_;
            fVar3 = auVar24._4_4_;
            auVar31._4_4_ = fVar4 * fVar3;
            auVar31._0_4_ = fVar4 * fVar2;
            fVar65 = auVar24._8_4_;
            auVar31._8_4_ = fVar4 * fVar65;
            fVar73 = auVar24._12_4_;
            auVar31._12_4_ = fVar4 * fVar73;
            auVar31._16_4_ = fVar4 * 0.0;
            auVar31._20_4_ = fVar4 * 0.0;
            auVar31._24_4_ = fVar4 * 0.0;
            auVar31._28_4_ = fVar4;
            auVar24 = vfmadd231ps_fma(auVar31,ZEXT1632(auVar5),auVar106);
            auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),ZEXT1632(auVar6),auVar99);
            auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),ZEXT1632(auVar7),auVar67);
            auVar35._4_4_ = uStack_14bc;
            auVar35._0_4_ = local_14c0;
            auVar35._8_4_ = uStack_14b8;
            auVar35._12_4_ = uStack_14b4;
            auVar35._16_4_ = uStack_14b0;
            auVar35._20_4_ = uStack_14ac;
            auVar35._24_4_ = uStack_14a8;
            auVar35._28_4_ = uStack_14a4;
            auVar100 = vandps_avx(ZEXT1632(auVar24),auVar35);
            uVar40 = auVar100._0_4_;
            auVar93._0_4_ = (float)(auVar59._0_4_ ^ uVar40);
            uVar18 = auVar100._4_4_;
            auVar93._4_4_ = (float)(auVar59._4_4_ ^ uVar18);
            uVar19 = auVar100._8_4_;
            auVar93._8_4_ = (float)(auVar59._8_4_ ^ uVar19);
            uVar20 = auVar100._12_4_;
            auVar93._12_4_ = (float)(auVar59._12_4_ ^ uVar20);
            fVar4 = auVar100._16_4_;
            auVar93._16_4_ = fVar4;
            fVar21 = auVar100._20_4_;
            auVar93._20_4_ = fVar21;
            fVar22 = auVar100._24_4_;
            auVar93._24_4_ = fVar22;
            fStack_1384 = auVar100._28_4_;
            auVar93._28_4_ = fStack_1384;
            auVar59 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar60,ZEXT1632(auVar7));
            auVar96._0_4_ = (float)(auVar59._0_4_ ^ uVar40);
            auVar96._4_4_ = (float)(auVar59._4_4_ ^ uVar18);
            auVar96._8_4_ = (float)(auVar59._8_4_ ^ uVar19);
            auVar96._12_4_ = (float)(auVar59._12_4_ ^ uVar20);
            auVar96._16_4_ = fVar4;
            auVar96._20_4_ = fVar21;
            auVar96._24_4_ = fVar22;
            auVar96._28_4_ = fStack_1384;
            auVar100 = vcmpps_avx(auVar93,ZEXT832(0) << 0x20,5);
            auVar60 = vcmpps_avx(auVar96,ZEXT832(0) << 0x20,5);
            auVar100 = vandps_avx(auVar60,auVar100);
            auVar71._8_4_ = 0x7fffffff;
            auVar71._0_8_ = 0x7fffffff7fffffff;
            auVar71._12_4_ = 0x7fffffff;
            auVar71._16_4_ = 0x7fffffff;
            auVar71._20_4_ = 0x7fffffff;
            auVar71._24_4_ = 0x7fffffff;
            auVar71._28_4_ = 0x7fffffff;
            local_1440 = vandps_avx(ZEXT1632(auVar24),auVar71);
            auVar60 = vcmpps_avx(ZEXT1632(auVar24),ZEXT832(0) << 0x20,4);
            auVar100 = vandps_avx(auVar100,auVar60);
            auVar103._0_4_ = auVar93._0_4_ + auVar96._0_4_;
            auVar103._4_4_ = auVar93._4_4_ + auVar96._4_4_;
            auVar103._8_4_ = auVar93._8_4_ + auVar96._8_4_;
            auVar103._12_4_ = auVar93._12_4_ + auVar96._12_4_;
            auVar103._16_4_ = fVar4 + fVar4;
            auVar103._20_4_ = fVar21 + fVar21;
            auVar103._24_4_ = fVar22 + fVar22;
            auVar103._28_4_ = fStack_1384 + fStack_1384;
            auVar60 = vcmpps_avx(auVar103,local_1440,2);
            auVar66 = auVar60 & auVar100;
            if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar66 >> 0x7f,0) != '\0') ||
                  (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar66 >> 0xbf,0) != '\0') ||
                (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar66[0x1f] < '\0') {
              auVar100 = vandps_avx(auVar100,auVar60);
              auVar59 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
              auVar32._4_4_ = fVar3 * auVar83._4_4_;
              auVar32._0_4_ = fVar2 * auVar83._0_4_;
              auVar32._8_4_ = fVar65 * auVar83._8_4_;
              auVar32._12_4_ = fVar73 * auVar83._12_4_;
              auVar32._16_4_ = auVar83._16_4_ * 0.0;
              auVar32._20_4_ = auVar83._20_4_ * 0.0;
              auVar32._24_4_ = auVar83._24_4_ * 0.0;
              auVar32._28_4_ = auVar83._28_4_;
              auVar23 = vfmadd213ps_fma(auVar82,ZEXT1632(auVar5),auVar32);
              auVar23 = vfmadd213ps_fma(auVar81,ZEXT1632(auVar6),ZEXT1632(auVar23));
              local_1460._0_4_ = (float)(uVar40 ^ auVar23._0_4_);
              local_1460._4_4_ = (float)(uVar18 ^ auVar23._4_4_);
              local_1460._8_4_ = (float)(uVar19 ^ auVar23._8_4_);
              local_1460._12_4_ = (float)(uVar20 ^ auVar23._12_4_);
              local_1460._16_4_ = fVar4;
              local_1460._20_4_ = fVar21;
              local_1460._24_4_ = fVar22;
              local_1460._28_4_ = fStack_1384;
              fVar75 = *(float *)(ray + k * 4 + 0x60);
              fVar64 = local_1440._0_4_;
              fVar72 = local_1440._4_4_;
              auVar33._4_4_ = fVar72 * fVar75;
              auVar33._0_4_ = fVar64 * fVar75;
              fVar74 = local_1440._8_4_;
              auVar33._8_4_ = fVar74 * fVar75;
              fVar76 = local_1440._12_4_;
              auVar33._12_4_ = fVar76 * fVar75;
              fVar78 = local_1440._16_4_;
              auVar33._16_4_ = fVar78 * fVar75;
              fVar79 = local_1440._20_4_;
              auVar33._20_4_ = fVar79 * fVar75;
              fVar80 = local_1440._24_4_;
              auVar33._24_4_ = fVar80 * fVar75;
              auVar33._28_4_ = fVar75;
              auVar100 = vcmpps_avx(auVar33,local_1460,1);
              local_1640 = *(float *)(ray + k * 4 + 0x100);
              auVar34._4_4_ = local_1640 * fVar72;
              auVar34._0_4_ = local_1640 * fVar64;
              auVar34._8_4_ = local_1640 * fVar74;
              auVar34._12_4_ = local_1640 * fVar76;
              auVar34._16_4_ = local_1640 * fVar78;
              auVar34._20_4_ = local_1640 * fVar79;
              auVar34._24_4_ = local_1640 * fVar80;
              auVar34._28_4_ = auVar83._28_4_;
              auVar60 = vcmpps_avx(local_1460,auVar34,2);
              auVar100 = vandps_avx(auVar100,auVar60);
              auVar23 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
              auVar59 = vpand_avx(auVar59,auVar23);
              auVar100 = vpmovzxwd_avx2(auVar59);
              auVar100 = vpslld_avx2(auVar100,0x1f);
              if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar100 >> 0x7f,0) != '\0') ||
                    (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar100 >> 0xbf,0) != '\0') ||
                  (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar100[0x1f] < '\0') {
                auVar60 = vsubps_avx(local_1440,auVar96);
                local_14a0 = vblendvps_avx(auVar93,auVar60,local_15c0);
                auVar60 = vsubps_avx(local_1440,auVar93);
                local_1480 = vblendvps_avx(auVar96,auVar60,local_15c0);
                local_1400 = vpsrad_avx2(auVar100,0x1f);
                local_1380._0_4_ = (float)local_15e0._0_4_ * auVar6._0_4_;
                local_1380._4_4_ = (float)local_15e0._4_4_ * auVar6._4_4_;
                local_1380._8_4_ = fStack_15d8 * auVar6._8_4_;
                local_1380._12_4_ = fStack_15d4 * auVar6._12_4_;
                local_1380._16_4_ = fStack_15d0 * 0.0;
                local_1380._20_4_ = fStack_15cc * 0.0;
                local_1380._24_4_ = fStack_15c8 * 0.0;
                local_1380._28_4_ = 0;
                local_1360._4_4_ = (float)local_15e0._4_4_ * auVar5._4_4_;
                local_1360._0_4_ = (float)local_15e0._0_4_ * auVar5._0_4_;
                local_1360._8_4_ = fStack_15d8 * auVar5._8_4_;
                local_1360._12_4_ = fStack_15d4 * auVar5._12_4_;
                local_1360._16_4_ = fStack_15d0 * 0.0;
                local_1360._20_4_ = fStack_15cc * 0.0;
                local_1360._24_4_ = fStack_15c8 * 0.0;
                local_1360._28_4_ = 0;
                local_1340._4_4_ = (float)local_15e0._4_4_ * fVar3;
                local_1340._0_4_ = (float)local_15e0._0_4_ * fVar2;
                local_1340._8_4_ = fStack_15d8 * fVar65;
                local_1340._12_4_ = fStack_15d4 * fVar73;
                local_1340._16_4_ = fStack_15d0 * 0.0;
                local_1340._20_4_ = fStack_15cc * 0.0;
                local_1340._24_4_ = fStack_15c8 * 0.0;
                local_1340._28_4_ = 0;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00658c4b:
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    return bVar36;
                  }
                  auVar63._0_8_ = (ulong)CONCAT24(uVar10,(uint)uVar10) & 0x7fff00007fff;
                  auVar63._8_4_ = uVar49;
                  auVar63._12_4_ = uVar49;
                  auVar63._16_4_ = uVar49;
                  auVar63._20_4_ = uVar49;
                  auVar63._24_4_ = uVar49;
                  auVar63._28_4_ = uVar49;
                  auVar100 = vpaddd_avx2(auVar63,_DAT_01fec4a0);
                  auVar88._0_4_ = (float)(int)(*(ushort *)(lVar42 + 8 + lVar48) - 1);
                  auVar88._4_12_ = auVar115._4_12_;
                  auVar86._0_8_ = (ulong)CONCAT24(uVar11,(uint)uVar11) & 0x7fff00007fff;
                  auVar86._8_4_ = uVar54;
                  auVar86._12_4_ = uVar54;
                  auVar86._16_4_ = uVar54;
                  auVar86._20_4_ = uVar54;
                  auVar86._24_4_ = uVar54;
                  auVar86._28_4_ = uVar54;
                  auVar60 = vpaddd_avx2(auVar86,_DAT_01fec4c0);
                  auVar23 = vrcpss_avx(auVar88,auVar88);
                  auVar24 = vfnmadd213ss_fma(auVar88,auVar23,SUB6416(ZEXT464(0x40000000),0));
                  auVar95._0_4_ = (float)(int)(*(ushort *)(lVar42 + 10 + lVar48) - 1);
                  auVar95._4_12_ = auVar115._4_12_;
                  fVar2 = auVar23._0_4_ * auVar24._0_4_;
                  auVar23 = vrcpss_avx(auVar95,auVar95);
                  auVar24 = vfnmadd213ss_fma(auVar95,auVar23,SUB6416(ZEXT464(0x40000000),0));
                  fVar3 = auVar23._0_4_ * auVar24._0_4_;
                  auVar100 = vcvtdq2ps_avx(auVar100);
                  fStack_13c4 = auVar100._28_4_ + local_14a0._28_4_;
                  auVar60 = vcvtdq2ps_avx(auVar60);
                  auVar66 = vrcpps_avx(local_1440);
                  auVar90._8_4_ = 0x3f800000;
                  auVar90._0_8_ = 0x3f8000003f800000;
                  auVar90._12_4_ = 0x3f800000;
                  auVar90._16_4_ = 0x3f800000;
                  auVar90._20_4_ = 0x3f800000;
                  auVar90._24_4_ = 0x3f800000;
                  auVar90._28_4_ = 0x3f800000;
                  auVar23 = vfnmadd213ps_fma(local_1440,auVar66,auVar90);
                  auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar66,auVar66);
                  fVar65 = auVar23._0_4_;
                  fVar73 = auVar23._4_4_;
                  fVar75 = auVar23._8_4_;
                  fVar77 = auVar23._12_4_;
                  local_13a0[0] = fVar65 * local_1460._0_4_;
                  local_13a0[1] = fVar73 * local_1460._4_4_;
                  local_13a0[2] = fVar75 * local_1460._8_4_;
                  local_13a0[3] = fVar77 * local_1460._12_4_;
                  fStack_1390 = fVar4 * 0.0;
                  fStack_138c = fVar21 * 0.0;
                  fStack_1388 = fVar22 * 0.0;
                  local_13e0[0] = (fVar64 * auVar100._0_4_ + local_14a0._0_4_) * fVar2 * fVar65;
                  local_13e0[1] = (fVar72 * auVar100._4_4_ + local_14a0._4_4_) * fVar2 * fVar73;
                  local_13e0[2] = (fVar74 * auVar100._8_4_ + local_14a0._8_4_) * fVar2 * fVar75;
                  local_13e0[3] = (fVar76 * auVar100._12_4_ + local_14a0._12_4_) * fVar2 * fVar77;
                  fStack_13d0 = (fVar78 * auVar100._16_4_ + local_14a0._16_4_) * fVar2 * 0.0;
                  fStack_13cc = (fVar79 * auVar100._20_4_ + local_14a0._20_4_) * fVar2 * 0.0;
                  fStack_13c8 = (fVar80 * auVar100._24_4_ + local_14a0._24_4_) * fVar2 * 0.0;
                  local_13c0[0] = (fVar64 * auVar60._0_4_ + local_1480._0_4_) * fVar3 * fVar65;
                  local_13c0[1] = (fVar72 * auVar60._4_4_ + local_1480._4_4_) * fVar3 * fVar73;
                  local_13c0[2] = (fVar74 * auVar60._8_4_ + local_1480._8_4_) * fVar3 * fVar75;
                  local_13c0[3] = (fVar76 * auVar60._12_4_ + local_1480._12_4_) * fVar3 * fVar77;
                  fStack_13b0 = (fVar78 * auVar60._16_4_ + local_1480._16_4_) * fVar3 * 0.0;
                  fStack_13ac = (fVar79 * auVar60._20_4_ + local_1480._20_4_) * fVar3 * 0.0;
                  fStack_13a8 = (fVar80 * auVar60._24_4_ + local_1480._24_4_) * fVar3 * 0.0;
                  fStack_13a4 = fStack_13c4;
                  auVar59 = vpsllw_avx(auVar59,0xf);
                  if ((((((((auVar59 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar59 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar59 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar59 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar59[0xf] < '\0') {
                    auVar59 = vpacksswb_avx(auVar59,auVar59);
                    uVar52 = 0;
                    uVar57 = (ulong)(byte)(SUB161(auVar59 >> 7,0) & 1 |
                                           (SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                                           (SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                                           (SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                                           (SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                                           (SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                                           (SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                                          SUB161(auVar59 >> 0x3f,0) << 7);
                    for (uVar43 = uVar57; (uVar43 & 1) == 0;
                        uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                      uVar52 = uVar52 + 1;
                    }
                    local_16a0 = CONCAT44(uStack_1698,uStack_1698);
                    local_1620 = auVar115._0_32_;
                    uStack_1694 = uStack_1698;
                    uStack_1690 = uStack_1698;
                    uStack_168c = uStack_1698;
                    uStack_1688 = uStack_1698;
                    uStack_1684 = uStack_1698;
                    uStack_167c = local_1680;
                    uStack_1678 = local_1680;
                    uStack_1674 = local_1680;
                    uStack_1670 = local_1680;
                    uStack_166c = local_1680;
                    uStack_1668 = local_1680;
                    uStack_1664 = local_1680;
                    fStack_163c = local_1640;
                    fStack_1638 = local_1640;
                    fStack_1634 = local_1640;
                    fStack_1630 = local_1640;
                    fStack_162c = local_1640;
                    fStack_1628 = local_1640;
                    fStack_1624 = local_1640;
                    do {
                      local_12c0 = local_13e0[uVar52];
                      local_12a0 = local_13c0[uVar52];
                      *(float *)(ray + k * 4 + 0x100) = local_13a0[uVar52];
                      uVar41 = *(undefined4 *)(local_1380 + uVar52 * 4);
                      local_1300 = *(undefined4 *)(local_1360 + uVar52 * 4);
                      local_12e0 = *(undefined4 *)(local_1340 + uVar52 * 4);
                      local_16d0.context = context->user;
                      local_1320[0] = (RTCHitN)(char)uVar41;
                      local_1320[1] = (RTCHitN)(char)((uint)uVar41 >> 8);
                      local_1320[2] = (RTCHitN)(char)((uint)uVar41 >> 0x10);
                      local_1320[3] = (RTCHitN)(char)((uint)uVar41 >> 0x18);
                      local_1320[4] = (RTCHitN)(char)uVar41;
                      local_1320[5] = (RTCHitN)(char)((uint)uVar41 >> 8);
                      local_1320[6] = (RTCHitN)(char)((uint)uVar41 >> 0x10);
                      local_1320[7] = (RTCHitN)(char)((uint)uVar41 >> 0x18);
                      local_1320[8] = (RTCHitN)(char)uVar41;
                      local_1320[9] = (RTCHitN)(char)((uint)uVar41 >> 8);
                      local_1320[10] = (RTCHitN)(char)((uint)uVar41 >> 0x10);
                      local_1320[0xb] = (RTCHitN)(char)((uint)uVar41 >> 0x18);
                      local_1320[0xc] = (RTCHitN)(char)uVar41;
                      local_1320[0xd] = (RTCHitN)(char)((uint)uVar41 >> 8);
                      local_1320[0xe] = (RTCHitN)(char)((uint)uVar41 >> 0x10);
                      local_1320[0xf] = (RTCHitN)(char)((uint)uVar41 >> 0x18);
                      local_1320[0x10] = (RTCHitN)(char)uVar41;
                      local_1320[0x11] = (RTCHitN)(char)((uint)uVar41 >> 8);
                      local_1320[0x12] = (RTCHitN)(char)((uint)uVar41 >> 0x10);
                      local_1320[0x13] = (RTCHitN)(char)((uint)uVar41 >> 0x18);
                      local_1320[0x14] = (RTCHitN)(char)uVar41;
                      local_1320[0x15] = (RTCHitN)(char)((uint)uVar41 >> 8);
                      local_1320[0x16] = (RTCHitN)(char)((uint)uVar41 >> 0x10);
                      local_1320[0x17] = (RTCHitN)(char)((uint)uVar41 >> 0x18);
                      local_1320[0x18] = (RTCHitN)(char)uVar41;
                      local_1320[0x19] = (RTCHitN)(char)((uint)uVar41 >> 8);
                      local_1320[0x1a] = (RTCHitN)(char)((uint)uVar41 >> 0x10);
                      local_1320[0x1b] = (RTCHitN)(char)((uint)uVar41 >> 0x18);
                      local_1320[0x1c] = (RTCHitN)(char)uVar41;
                      local_1320[0x1d] = (RTCHitN)(char)((uint)uVar41 >> 8);
                      local_1320[0x1e] = (RTCHitN)(char)((uint)uVar41 >> 0x10);
                      local_1320[0x1f] = (RTCHitN)(char)((uint)uVar41 >> 0x18);
                      uStack_12fc = local_1300;
                      uStack_12f8 = local_1300;
                      uStack_12f4 = local_1300;
                      uStack_12f0 = local_1300;
                      uStack_12ec = local_1300;
                      uStack_12e8 = local_1300;
                      uStack_12e4 = local_1300;
                      uStack_12dc = local_12e0;
                      uStack_12d8 = local_12e0;
                      uStack_12d4 = local_12e0;
                      uStack_12d0 = local_12e0;
                      uStack_12cc = local_12e0;
                      uStack_12c8 = local_12e0;
                      uStack_12c4 = local_12e0;
                      fStack_12bc = local_12c0;
                      fStack_12b8 = local_12c0;
                      fStack_12b4 = local_12c0;
                      fStack_12b0 = local_12c0;
                      fStack_12ac = local_12c0;
                      fStack_12a8 = local_12c0;
                      fStack_12a4 = local_12c0;
                      fStack_129c = local_12a0;
                      fStack_1298 = local_12a0;
                      fStack_1294 = local_12a0;
                      fStack_1290 = local_12a0;
                      fStack_128c = local_12a0;
                      fStack_1288 = local_12a0;
                      fStack_1284 = local_12a0;
                      local_1280 = local_16a0;
                      uStack_1278 = CONCAT44(uStack_1694,uStack_1698);
                      uStack_1270 = CONCAT44(uStack_168c,uStack_1690);
                      uStack_1268 = CONCAT44(uStack_1684,uStack_1688);
                      local_1260._4_4_ = uStack_167c;
                      local_1260._0_4_ = local_1680;
                      local_1260._8_4_ = uStack_1678;
                      local_1260._12_4_ = uStack_1674;
                      local_1260._16_4_ = uStack_1670;
                      local_1260._20_4_ = uStack_166c;
                      local_1260._24_4_ = uStack_1668;
                      local_1260._28_4_ = uStack_1664;
                      vpcmpeqd_avx2(local_1260,local_1260);
                      uStack_123c = (local_16d0.context)->instID[0];
                      local_1240 = uStack_123c;
                      uStack_1238 = uStack_123c;
                      uStack_1234 = uStack_123c;
                      uStack_1230 = uStack_123c;
                      uStack_122c = uStack_123c;
                      uStack_1228 = uStack_123c;
                      uStack_1224 = uStack_123c;
                      uStack_121c = (local_16d0.context)->instPrimID[0];
                      local_1220 = uStack_121c;
                      uStack_1218 = uStack_121c;
                      uStack_1214 = uStack_121c;
                      uStack_1210 = uStack_121c;
                      uStack_120c = uStack_121c;
                      uStack_1208 = uStack_121c;
                      uStack_1204 = uStack_121c;
                      local_1660 = local_1600;
                      local_16d0.valid = (int *)local_1660;
                      local_16d0.geometryUserPtr = pGVar12->userPtr;
                      local_16d0.hit = local_1320;
                      local_16d0.N = 8;
                      local_16d0.ray = (RTCRayN *)ray;
                      if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar12->occlusionFilterN)(&local_16d0);
                      }
                      auVar60 = vpcmpeqd_avx2(local_1660,_DAT_01faff00);
                      auVar100 = _DAT_01fe9960 & ~auVar60;
                      if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar100 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar100 >> 0x7f,0) == '\0') &&
                            (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar100 >> 0xbf,0) == '\0') &&
                          (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar100[0x1f]) {
                        auVar60 = auVar60 ^ _DAT_01fe9960;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var13)(&local_16d0);
                        }
                        auVar100 = vpcmpeqd_avx2(local_1660,_DAT_01faff00);
                        auVar60 = auVar100 ^ _DAT_01fe9960;
                        auVar87._8_4_ = 0xff800000;
                        auVar87._0_8_ = 0xff800000ff800000;
                        auVar87._12_4_ = 0xff800000;
                        auVar87._16_4_ = 0xff800000;
                        auVar87._20_4_ = 0xff800000;
                        auVar87._24_4_ = 0xff800000;
                        auVar87._28_4_ = 0xff800000;
                        auVar100 = vblendvps_avx(auVar87,*(undefined1 (*) [32])
                                                          (local_16d0.ray + 0x100),auVar100);
                        *(undefined1 (*) [32])(local_16d0.ray + 0x100) = auVar100;
                      }
                      if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar60 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar60 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar60 >> 0x7f,0) != '\0') ||
                            (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar60 >> 0xbf,0) != '\0') ||
                          (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar60[0x1f] < '\0') goto LAB_00658c4b;
                      *(float *)(ray + k * 4 + 0x100) = local_1640;
                      uVar43 = uVar52 & 0x3f;
                      uVar52 = 0;
                      uVar57 = uVar57 ^ 1L << uVar43;
                      for (uVar43 = uVar57; (uVar43 & 1) == 0;
                          uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                        uVar52 = uVar52 + 1;
                      }
                      auVar115 = ZEXT3264(local_1620);
                    } while (uVar57 != 0);
                  }
                }
              }
            }
            uVar44 = uVar44 - 1 & uVar44;
          } while (uVar44 != 0);
        }
        lVar38 = lVar38 + 1;
        auVar94 = ZEXT3264(local_14e0);
        auVar97 = ZEXT3264(local_1500);
        auVar101 = ZEXT3264(local_1520);
        auVar104 = ZEXT3264(local_1540);
        auVar107 = ZEXT3264(local_1560);
        auVar110 = ZEXT3264(local_1580);
        auVar114 = ZEXT3264(local_15a0);
      } while (lVar38 != uVar55 - 8);
    }
joined_r0x006582ba:
    bVar36 = puVar45 != &local_1200;
    if (!bVar36) {
      return bVar36;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }